

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O0

KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_> __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
::get(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
      *this,unsigned_long index)

{
  element_type *peVar1;
  ByteArray<3UL> extraout_RDX;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  *in_RDI;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_> KVar3;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  *this_00;
  string_type *__source;
  path *in_stack_ffffffffffffff70;
  FileManager *in_stack_ffffffffffffff78;
  string_type local_80 [4];
  format fVar2;
  
  this_00 = in_RDI;
  getFileManager(in_RDI);
  peVar1 = std::
           __shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b0225);
  fVar2 = (format)((ulong)peVar1 >> 0x38);
  __source = local_80;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,unsigned_long,void>
  ::getStorageFilePath_abi_cxx11_(this_00);
  std::filesystem::__cxx11::path::path(in_stack_ffffffffffffff70,__source,fVar2);
  io::FileManager::
  getInputIterator<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,unsigned_long>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(uint64_t)__source);
  io::
  InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_5UL,_void>
  ::next((InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_5UL,_void>
          *)this_00);
  io::
  InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_5UL,_void>
  ::~InputIterator((InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_5UL,_void>
                    *)0x1b029a);
  std::filesystem::__cxx11::path::~path((path *)in_RDI);
  std::__cxx11::string::~string((string *)local_80);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x1b02bb);
  KVar3.value.data_._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
  ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       extraout_RDX.data_._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  KVar3._0_8_ = this_00;
  return KVar3;
}

Assistant:

[[nodiscard]] T get(IndexT index) const override {
        assert(index < getItemsCount());
        return getFileManager()->template getInputIterator<T, IndexT>(
            getStorageFilePath(),
            index * io::FixedDeserializedSizeRegister<T>::exactDeserializedSize
        ).next();
    }